

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tensor_tools.cpp
# Opt level: O1

void dlib::tt::smelu(tensor *dest,tensor *src,float beta)

{
  uint *puVar1;
  ostream *poVar2;
  fatal_error *this;
  ostringstream dlib_o_out;
  string local_1b0;
  long local_190 [3];
  uint auStack_178 [88];
  
  if (0.0 < beta) {
    cpu::smelu(dest,src,beta);
    return;
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_190);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_190,"\n\nError detected at line ",0x19);
  poVar2 = (ostream *)std::ostream::operator<<((ostream *)local_190,0x4b2);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,".\n",2);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_190,"Error detected in file ",0x17);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_190,
             "/workspace/llm4binary/github/license_c_cmakelists/arrufat[P]dlib-pytorch-benchmark/external/dlib/dlib/cuda/tensor_tools.cpp"
             ,0x7b);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,".\n",2);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_190,"Error detected in function ",0x1b);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_190,"void dlib::tt::smelu(tensor &, const tensor &, const float)",0x3b
            );
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,".\n\n",3);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_190,"Failing expression was ",0x17);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,"beta > 0",8);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,".\n",2);
  puVar1 = (uint *)((long)auStack_178 + *(long *)(local_190[0] + -0x18));
  *puVar1 = *puVar1 | 1;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,"",0);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,"\n",1);
  this = (fatal_error *)__cxa_allocate_exception(0x30);
  std::__cxx11::stringbuf::str();
  fatal_error::fatal_error(this,EBROKEN_ASSERT,&local_1b0);
  __cxa_throw(this,&fatal_error::typeinfo,error::~error);
}

Assistant:

void smelu (
        tensor& dest,
        const tensor& src,
        const float beta
    )
    {
        DLIB_CASSERT(beta > 0);
#ifdef DLIB_USE_CUDA
        cuda::smelu(dest, src, beta);
#else
        cpu::smelu(dest, src, beta);
#endif
    }